

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

void Cbs_QuePush(Cbs_Que_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t **local_20;
  Gia_Obj_t *pObj_local;
  Cbs_Que_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 == 0) {
    if (p->iTail == p->nSize) {
      p->nSize = p->nSize << 1;
      if (p->pData == (Gia_Obj_t **)0x0) {
        local_20 = (Gia_Obj_t **)malloc((long)p->nSize << 3);
      }
      else {
        local_20 = (Gia_Obj_t **)realloc(p->pData,(long)p->nSize << 3);
      }
      p->pData = local_20;
    }
    iVar1 = p->iTail;
    p->iTail = iVar1 + 1;
    p->pData[iVar1] = pObj;
    return;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Cbs_QuePush( Cbs_Que_t * p, Gia_Obj_t * pObj )
{
    assert( !Gia_IsComplement(pObj) );
    if ( p->iTail == p->nSize )
    {
        p->nSize *= 2;
        p->pData = ABC_REALLOC( Gia_Obj_t *, p->pData, p->nSize ); 
    }
    p->pData[p->iTail++] = pObj;
}